

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O1

Promise<kj::Maybe<capnp::MessageReaderAndFds>_> __thiscall
capnp::AsyncIoMessageStream::tryReadMessage
          (AsyncIoMessageStream *this,ArrayPtr<kj::OwnFd> fdSpace,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  PromiseArena *pPVar1;
  AsyncInputStream AVar2;
  PromiseArenaMember *in_RAX;
  void *pvVar3;
  ulong in_R9;
  TransformPromiseNodeBase *this_00;
  ReaderOptions options_00;
  ArrayPtr<capnp::word> scratchSpace_00;
  AsyncInputStream local_28;
  
  scratchSpace_00.ptr = (word *)(in_R9 & 0xffffffff);
  options_00._8_8_ = options._8_8_;
  options_00.traversalLimitInWords = *(uint64_t *)(fdSpace.ptr + 2);
  scratchSpace_00.size_ = (size_t)scratchSpace.ptr;
  local_28._vptr_AsyncInputStream = (_func_int **)in_RAX;
  capnp::tryReadMessage(&local_28,options_00,scratchSpace_00);
  AVar2._vptr_AsyncInputStream = local_28._vptr_AsyncInputStream;
  pPVar1 = (PromiseArena *)local_28._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_28._vptr_AsyncInputStream - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_28,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:439:11)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_006f7258;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_28._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_28._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_28,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:439:11)>
               ::anon_class_1_0_00000001_for_func::operator());
    AVar2._vptr_AsyncInputStream[-5] = (_func_int *)&PTR_destroy_006f7258;
    ((PromiseArenaMember *)(AVar2._vptr_AsyncInputStream + -4))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  AVar2._vptr_AsyncInputStream = local_28._vptr_AsyncInputStream;
  (this->super_MessageStream)._vptr_MessageStream = (_func_int **)this_00;
  if ((PromiseArenaMember *)local_28._vptr_AsyncInputStream != (PromiseArenaMember *)0x0) {
    local_28._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar2._vptr_AsyncInputStream);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> AsyncIoMessageStream::tryReadMessage(
    kj::ArrayPtr<kj::OwnFd> fdSpace,
    ReaderOptions options,
    kj::ArrayPtr<word> scratchSpace) {
  return capnp::tryReadMessage(stream, options, scratchSpace)
    .then([](kj::Maybe<kj::Own<MessageReader>> maybeReader) -> kj::Maybe<MessageReaderAndFds> {
      KJ_IF_SOME(reader, maybeReader) {
        return MessageReaderAndFds { kj::mv(reader), nullptr };
      } else {
        return kj::none;
      }
    });
}